

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_function.c
# Opt level: O3

nativeFunc get_native_function(char *function_name)

{
  uint uVar1;
  module *pmVar2;
  table_pointer ptVar3;
  element_pointer paVar4;
  function_index *pfVar5;
  function_index *pfVar6;
  int iVar7;
  code *pcVar8;
  nativeFunc extraout_RAX;
  nativeFunc p_Var9;
  uint64 uVar10;
  ulong uVar11;
  nativeFunc p_Var12;
  
  iVar7 = strcmp(function_name,"print_char");
  if (iVar7 == 0) {
    pcVar8 = print_char;
  }
  else {
    iVar7 = strcmp(function_name,"assert_true");
    if (iVar7 == 0) {
      pcVar8 = assert_true;
    }
    else {
      iVar7 = strcmp(function_name,"assert_false");
      if (iVar7 == 0) {
        pcVar8 = assert_false;
      }
      else {
        iVar7 = strcmp(function_name,"assert_eq_i32");
        if (iVar7 == 0) {
          pcVar8 = assert_eq_i32;
        }
        else {
          iVar7 = strcmp(function_name,"assert_eq_i64");
          if (iVar7 == 0) {
            pcVar8 = assert_eq_i64;
          }
          else {
            iVar7 = strcmp(function_name,"assert_eq_f32");
            if (iVar7 == 0) {
              pcVar8 = assert_eq_f32;
            }
            else {
              iVar7 = strcmp(function_name,"assert_eq_f64");
              if (iVar7 != 0) {
                get_native_function_cold_1();
                pmVar2 = ((vm *)function_name)->m;
                p_Var9 = extraout_RAX;
                if ((pmVar2->table_sec).table_segment_count != 0) {
                  ptVar3 = (pmVar2->table_sec).table_segment_addr;
                  (((vm *)function_name)->table).table_type = ptVar3;
                  uVar1 = (&(ptVar3->limit).min)[(ptVar3->limit).tag != '\0'];
                  (((vm *)function_name)->table).itemCount = uVar1;
                  p_Var9 = (nativeFunc)malloc((ulong)uVar1 << 2);
                  (((vm *)function_name)->table).item = (function_index *)p_Var9;
                  if ((pmVar2->element_sec).element_segment_count != 0) {
                    p_Var12 = (nativeFunc)0x0;
                    do {
                      paVar4 = (pmVar2->element_sec).element_segment_addr;
                      execInst((vm *)function_name,&paVar4[(long)p_Var12].offset);
                      uVar10 = popU64((stack *)function_name);
                      if (*(uint32 *)(&paVar4[(long)p_Var12].offset + 1) != 0) {
                        pfVar5 = paVar4[(long)p_Var12].init_data;
                        pfVar6 = (((vm *)function_name)->table).item;
                        uVar11 = 0;
                        do {
                          pfVar6[(uint)((int)uVar10 + (int)uVar11)] = pfVar5[uVar11];
                          uVar11 = uVar11 + 1;
                        } while (uVar11 < paVar4[(long)p_Var12].init_data_count);
                      }
                      p_Var12 = p_Var12 + 1;
                      p_Var9 = (nativeFunc)(ulong)(pmVar2->element_sec).element_segment_count;
                    } while (p_Var12 < p_Var9);
                  }
                }
                return p_Var9;
              }
              pcVar8 = assert_eq_f64;
            }
          }
        }
      }
    }
  }
  return pcVar8;
}

Assistant:

nativeFunc get_native_function(const char *function_name) {
    if (!strcmp(function_name, "print_char")) {
        return print_char;
    } else if (!strcmp(function_name, "assert_true")) {
        return assert_true;
    } else if (!strcmp(function_name, "assert_false")) {
        return assert_false;
    } else if (!strcmp(function_name, "assert_eq_i32")) {
        return assert_eq_i32;
    } else if (!strcmp(function_name, "assert_eq_i64")) {
        return assert_eq_i64;
    } else if (!strcmp(function_name, "assert_eq_f32")) {
        return assert_eq_f32;
    } else if (!strcmp(function_name, "assert_eq_f64")) {
        return assert_eq_f64;
    } else {
        errorExit("unknown native function");
    }
    return NULL;
}